

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

IGeneratorTracker * __thiscall
Catch::RunContext::createGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo lineInfo,
          GeneratorBasePtr *generator)

{
  unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker> this_00;
  bool bVar1;
  NameAndLocation *lhs;
  int __oflag;
  char *__file;
  IGeneratorTracker *local_100;
  unique_ptr<Catch::TestCaseTracking::ITracker> local_c0;
  GeneratorTracker *local_b8;
  GeneratorTracker *ret;
  unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker> local_a8;
  unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker> newTracker;
  ITracker *currentTracker;
  string local_88;
  undefined1 local_68 [8];
  NameAndLocation nameAndLoc;
  GeneratorBasePtr *generator_local;
  RunContext *this_local;
  SourceLineInfo lineInfo_local;
  StringRef generatorName_local;
  
  lineInfo_local.file = (char *)lineInfo.line;
  this_local = (RunContext *)lineInfo.file;
  lineInfo_local.line = (size_t)generatorName.m_start;
  nameAndLoc.location.line = (size_t)generator;
  StringRef::operator_cast_to_string(&local_88,(StringRef *)&lineInfo_local.line);
  TestCaseTracking::NameAndLocation::NameAndLocation
            ((NameAndLocation *)local_68,&local_88,(SourceLineInfo *)&this_local);
  std::__cxx11::string::~string((string *)&local_88);
  newTracker.m_ptr =
       (GeneratorTracker *)TestCaseTracking::TrackerContext::currentTracker(&this->m_trackerContext)
  ;
  lhs = TestCaseTracking::ITracker::nameAndLocation((ITracker *)newTracker.m_ptr);
  bVar1 = TestCaseTracking::operator!=(lhs,(NameAndLocation *)local_68);
  if (!bVar1) {
    __assert_fail("currentTracker.nameAndLocation() != nameAndLoc && \"Trying to create tracker for a genreator that already has one\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1524,
                  "virtual IGeneratorTracker *Catch::RunContext::createGeneratorTracker(StringRef, SourceLineInfo, Generators::GeneratorBasePtr &&)"
                 );
  }
  ret = newTracker.m_ptr;
  Detail::
  make_unique<Catch::Generators::(anonymous_namespace)::GeneratorTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
            ((Detail *)&local_a8,(NameAndLocation *)local_68,&this->m_trackerContext,
             (ITracker **)&ret);
  local_b8 = Detail::unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker>::get
                       (&local_a8);
  this_00 = newTracker;
  Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::
  unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker,void>(&local_c0,&local_a8);
  TestCaseTracking::ITracker::addChild((ITracker *)this_00.m_ptr,&local_c0);
  Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::~unique_ptr(&local_c0);
  __file = (char *)nameAndLoc.location.line;
  Generators::anon_unknown_3::GeneratorTracker::setGenerator
            (local_b8,(GeneratorBasePtr *)nameAndLoc.location.line);
  TestCaseTracking::TrackerBase::open(&local_b8->super_TrackerBase,__file,__oflag);
  local_100 = (IGeneratorTracker *)0x0;
  if (local_b8 != (GeneratorTracker *)0x0) {
    local_100 = &local_b8->super_IGeneratorTracker;
  }
  Detail::unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker>::~unique_ptr
            (&local_a8);
  TestCaseTracking::NameAndLocation::~NameAndLocation((NameAndLocation *)local_68);
  return local_100;
}

Assistant:

IGeneratorTracker* RunContext::createGeneratorTracker(
        StringRef generatorName,
        SourceLineInfo lineInfo,
        Generators::GeneratorBasePtr&& generator ) {

        auto nameAndLoc = TestCaseTracking::NameAndLocation( static_cast<std::string>( generatorName ), lineInfo );
        auto& currentTracker = m_trackerContext.currentTracker();
        assert(
            currentTracker.nameAndLocation() != nameAndLoc &&
            "Trying to create tracker for a genreator that already has one" );

        auto newTracker = Catch::Detail::make_unique<Generators::GeneratorTracker>(
            CATCH_MOVE(nameAndLoc), m_trackerContext, &currentTracker );
        auto ret = newTracker.get();
        currentTracker.addChild( CATCH_MOVE( newTracker ) );

        ret->setGenerator( CATCH_MOVE( generator ) );
        ret->open();
        return ret;
    }